

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall PreciseMeasurement_doubleOps_Test::TestBody(PreciseMeasurement_doubleOps_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  double dVar3;
  AssertHelper local_340;
  Message local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_6;
  precise_measurement fd8;
  AssertHelper local_2e8;
  Message local_2e0;
  bool local_2d1;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__3;
  precise_measurement fd7;
  AssertHelper local_288;
  Message local_280;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__2;
  precise_measurement fd6;
  Message local_240;
  precise_unit local_238;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_5;
  Message local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_4;
  precise_measurement fd2;
  Message local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_3;
  precise_measurement fd10;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_2;
  precise_measurement fd9;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  precise_measurement fd3;
  AssertHelper local_118;
  Message local_110;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__1;
  precise_measurement freq3;
  AssertHelper local_b8;
  Message local_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  precise_measurement freq2;
  Message local_70 [3];
  precise_unit local_58;
  precise_unit local_48;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  precise_measurement freq;
  PreciseMeasurement_doubleOps_Test *this_local;
  
  units::operator/((precise_measurement *)&gtest_ar.message_,9.0,(precise_unit *)units::precise::s);
  local_48 = units::precise_measurement::units((precise_measurement *)&gtest_ar.message_);
  local_58 = units::precise_unit::operator/
                       ((precise_unit *)units::precise::one,(precise_unit *)units::precise::s);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_38,"freq.units()","precise::one / precise::s",&local_48,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&freq2.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1f9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&freq2.units_.base_units_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&freq2.units_.base_units_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  units::operator*((precise_measurement *)&gtest_ar_.message_,9.0,(precise_unit *)units::precise::Hz
                  );
  local_a1 = units::precise_measurement::operator==
                       ((precise_measurement *)&gtest_ar.message_,
                        (precise_measurement *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&freq3.units_.base_units_,(internal *)local_a0,
               (AssertionResult *)"freq == freq2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1fb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&freq3.units_.base_units_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  units::operator/((precise_measurement *)&gtest_ar__1.message_,(precise_unit *)units::precise::Hz,
                   0.1111111111111111);
  local_101 = units::precise_measurement::operator==
                        ((precise_measurement *)&gtest_ar__1.message_,
                         (precise_measurement *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_100,&local_101,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&fd3.units_.base_units_,(internal *)local_100,
               (AssertionResult *)"freq3 == freq2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1fe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&fd3.units_.base_units_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  units::precise_measurement::operator/
            ((precise_measurement *)&gtest_ar_1.message_,(precise_measurement *)&gtest_ar.message_,
             3.0);
  dVar3 = units::precise_measurement::value((precise_measurement *)&gtest_ar_1.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_160,"fd3.value()","3.0",dVar3,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fd9.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x201,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fd9.units_.base_units_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fd9.units_.base_units_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  units::precise_measurement::operator*
            ((precise_measurement *)&gtest_ar_2.message_,(precise_measurement *)&gtest_ar.message_,
             3.0);
  dVar3 = units::precise_measurement::value((precise_measurement *)&gtest_ar_2.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_198,"fd9.value()","27.0",dVar3,27.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fd10.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x204,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fd10.units_.base_units_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fd10.units_.base_units_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  units::operator*((precise_measurement *)&gtest_ar_3.message_,3.0,
                   (precise_measurement *)&gtest_ar.message_);
  dVar3 = units::precise_measurement::value((precise_measurement *)&gtest_ar_3.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d0,"fd10.value()","27.0",dVar3,27.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fd2.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x207,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fd2.units_.base_units_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fd2.units_.base_units_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  units::operator/((precise_measurement *)&gtest_ar_4.message_,27.0,
                   (precise_measurement *)&gtest_ar.message_);
  dVar3 = units::precise_measurement::value((precise_measurement *)&gtest_ar_4.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_208,"fd2.value()","3.0",dVar3,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x209,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_238 = units::precise_measurement::units((precise_measurement *)&gtest_ar_4.message_);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_228,"fd2.units()","precise::s",&local_238,
             (precise_unit *)units::precise::s);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fd6.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x20a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fd6.units_.base_units_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fd6.units_.base_units_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  units::operator*((precise_measurement *)&gtest_ar__2.message_,(precise_unit *)units::precise::Hz,
                   9.0);
  local_271 = units::precise_measurement::operator==
                        ((precise_measurement *)&gtest_ar__2.message_,
                         (precise_measurement *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_270,&local_271,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&fd7.units_.base_units_,(internal *)local_270,
               (AssertionResult *)"fd6 == freq2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x20d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    std::__cxx11::string::~string((string *)&fd7.units_.base_units_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  units::operator/((precise_measurement *)&gtest_ar__3.message_,9.0,
                   (precise_unit *)units::precise::s);
  local_2d1 = units::precise_measurement::operator==
                        ((precise_measurement *)&gtest_ar__3.message_,
                         (precise_measurement *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d0,&local_2d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&fd8.units_.base_units_,(internal *)local_2d0,
               (AssertionResult *)"fd7 == freq2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x210,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    std::__cxx11::string::~string((string *)&fd8.units_.base_units_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  units::operator/((precise_measurement *)&gtest_ar_6.message_,(precise_unit *)units::precise::Hz,
                   0.5);
  dVar3 = units::precise_measurement::value((precise_measurement *)&gtest_ar_6.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_330,"fd8.value()","2.0",dVar3,2.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x213,pcVar2);
    testing::internal::AssertHelper::operator=(&local_340,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  return;
}

Assistant:

TEST(PreciseMeasurement, doubleOps)
{
    auto freq = 9.0 / precise::s;
    EXPECT_EQ(freq.units(), precise::one / precise::s);
    auto freq2 = 9.0 * precise::Hz;
    EXPECT_TRUE(freq == freq2);

    auto freq3 = precise::Hz / (1.0 / 9.0);
    EXPECT_TRUE(freq3 == freq2);

    auto fd3 = freq / 3;
    EXPECT_DOUBLE_EQ(fd3.value(), 3.0);

    auto fd9 = freq * 3;
    EXPECT_DOUBLE_EQ(fd9.value(), 27.0);

    auto fd10 = 3.0 * freq;
    EXPECT_DOUBLE_EQ(fd10.value(), 27.0);
    auto fd2 = 27.0 / freq;
    EXPECT_DOUBLE_EQ(fd2.value(), 3.0);
    EXPECT_EQ(fd2.units(), precise::s);

    auto fd6 = precise::Hz * 9.0;
    EXPECT_TRUE(fd6 == freq2);

    auto fd7 = 9.0 / precise::s;
    EXPECT_TRUE(fd7 == freq2);

    auto fd8 = precise::Hz / 0.5;
    EXPECT_DOUBLE_EQ(fd8.value(), 2.0);
}